

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtree.c
# Opt level: O2

IceTImage icetVtreeCompose(void)

{
  node_info *pnVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  IceTImage image;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  node_info *pnVar15;
  IceTBoolean *params;
  long lVar16;
  int *piVar17;
  int *piVar18;
  ulong uVar19;
  node_info *pnVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  node_info *pnVar25;
  IceTInt num_tiles;
  IceTInt num_proc;
  IceTInt rank;
  IceTImage local_c8;
  IceTInt *local_c0;
  IceTInt tile_displayed;
  long local_b0;
  node_info *local_a8;
  int local_a0;
  int local_9c;
  IceTSparseImage local_98;
  IceTVoid *local_90;
  ulong local_88;
  IceTInt *local_80;
  node_info *local_78;
  int *local_70;
  int *local_68;
  IceTInt max_height;
  IceTInt max_width;
  undefined8 uStack_58;
  undefined4 uStack_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  icetGetIntegerv(2,&rank);
  icetGetIntegerv(3,&num_proc);
  icetGetIntegerv(0x10,&num_tiles);
  icetGetIntegerv(0x13,&max_width);
  icetGetIntegerv(0x14,&max_height);
  local_c0 = icetUnsafeStateGetInteger(0x1a);
  local_80 = icetUnsafeStateGetInteger(0x11);
  icetGetIntegerv(0x1b,&tile_displayed);
  uVar14 = icetSparseImageBufferSize(max_width,max_height);
  local_c8 = icetGetStateBufferImage(0x1a0,max_width,max_height);
  local_88 = (ulong)uVar14;
  local_90 = icetGetStateBuffer(0x1a1,uVar14);
  local_98 = icetGetStateBufferSparseImage(0x1a2,max_width,max_height);
  pnVar15 = (node_info *)icetGetStateBuffer(0x1a3,num_proc * 0x1c);
  params = (IceTBoolean *)icetGetStateBuffer(0x1a4,num_tiles * num_proc);
  icetGetBooleanv(0x89,params);
  for (lVar16 = 0; lVar16 < num_proc; lVar16 = lVar16 + 1) {
    pnVar15[lVar16].rank = (int)lVar16;
    pnVar15[lVar16].num_contained = 0;
    pnVar15[lVar16].tile_held = -1;
    iVar21 = 0;
    for (iVar22 = 0; iVar22 < num_tiles; iVar22 = iVar22 + 1) {
      if (params[num_tiles * (int)lVar16 + iVar22] != '\0') {
        iVar21 = iVar21 + 1;
        pnVar15[lVar16].num_contained = iVar21;
      }
    }
  }
  local_68 = &pnVar15->tile_receiving;
  local_70 = &pnVar15[1].recv_src;
  local_78 = pnVar15 + -1;
  local_a8 = pnVar15;
  iVar21 = -1;
  do {
    local_9c = iVar21;
    iVar21 = 1;
    if (1 < num_proc) {
      iVar21 = num_proc;
    }
    uVar19 = 0;
    bVar12 = false;
LAB_00114c76:
    bVar13 = bVar12;
    pnVar15 = local_a8 + uVar19;
    while (pnVar25 = pnVar15, iVar21 - 1 != uVar19) {
      uVar19 = uVar19 + 1;
      pnVar15 = pnVar25 + 1;
      if (pnVar25[1].num_contained < pnVar25->num_contained) goto code_r0x00114c96;
    }
    uVar19 = 0;
    bVar12 = false;
    if (bVar13) goto LAB_00114c76;
    piVar17 = local_68;
    for (lVar16 = 0; lVar16 < num_proc; lVar16 = lVar16 + 1) {
      *(undefined8 *)(piVar17 + -1) = 0xffffffffffffffff;
      piVar17 = piVar17 + 7;
    }
    lVar16 = 1;
    bVar12 = false;
    pnVar15 = local_a8;
    piVar17 = local_70;
    for (lVar24 = 0; lVar24 < num_proc; lVar24 = lVar24 + 1) {
      bVar13 = bVar12;
      if (pnVar15[lVar24].tile_receiving < 0) {
        pnVar25 = pnVar15 + lVar24;
        iVar21 = pnVar25->tile_held;
        local_b0 = lVar16;
        bVar6 = bVar12;
        if ((long)iVar21 < 0) {
LAB_00114e3a:
          for (uVar19 = 0; lVar16 = local_b0, bVar13 = bVar6, (long)uVar19 < (long)num_tiles;
              uVar19 = uVar19 + 1) {
            if ((((params[uVar19 + (long)(pnVar25->rank * num_tiles)] != '\0') ||
                 (local_c0[uVar19] == pnVar25->rank)) && (uVar19 != (uint)pnVar25->tile_sending)) &&
               (iVar21 = find_sender(pnVar15,num_proc,(int)lVar24,(int)uVar19,local_c0[uVar19],
                                     num_tiles,params), pnVar15 = local_a8, iVar21 != 0)) {
              lVar16 = local_b0;
              bVar13 = true;
              break;
            }
          }
        }
        else {
          iVar21 = find_sender(pnVar15,num_proc,(int)lVar24,iVar21,local_c0[iVar21],num_tiles,params
                              );
          bVar6 = true;
          pnVar15 = local_a8;
          lVar16 = local_b0;
          bVar13 = bVar6;
          if ((iVar21 == 0) && (bVar13 = bVar12, pnVar25->tile_sending < 0)) {
            iVar21 = pnVar25->rank;
            iVar22 = pnVar25->tile_held;
            if (iVar21 != local_c0[iVar22]) {
              piVar18 = piVar17;
              for (lVar23 = local_b0; local_a0 = iVar21, lVar23 < num_proc; lVar23 = lVar23 + 1) {
                if (((piVar18[-2] < 0) && ((piVar18[-4] < 0 || (piVar18[-4] == iVar22)))) &&
                   ((iVar2 = ((node_info *)(piVar18 + -6))->rank, iVar2 == local_c0[iVar22] ||
                    (params[iVar2 * num_tiles + iVar22] != '\0')))) {
                  piVar18[-4] = iVar22;
                  piVar18[-2] = iVar22;
                  *piVar18 = iVar21;
                  pnVar25->tile_sending = iVar22;
                  pnVar25->send_dest = iVar2;
                  if (pnVar25->tile_held == iVar22) {
                    pnVar25->tile_held = -1;
                  }
                  pnVar25->num_contained = pnVar25->num_contained + -1;
                  params[iVar21 * num_tiles + iVar22] = '\0';
                  goto LAB_00114e3a;
                }
                piVar18 = piVar18 + 7;
              }
            }
          }
        }
      }
      bVar12 = bVar13;
      piVar17 = piVar17 + 7;
      lVar16 = lVar16 + 1;
    }
    uVar14 = num_proc;
    if (num_proc < 1) {
      uVar14 = 0;
    }
    lVar16 = (ulong)uVar14 + 1;
    pnVar15 = local_78;
    do {
      lVar16 = lVar16 + -1;
      if (lVar16 == 0) {
        pnVar25 = (node_info *)0x0;
        break;
      }
      pnVar25 = pnVar15 + 1;
      pnVar20 = pnVar15 + 1;
      pnVar15 = pnVar25;
    } while (pnVar20->rank != rank);
    do_send_receive(pnVar25,local_9c,num_tiles,params,local_c8,local_90,(IceTSizeType)local_88,
                    local_98);
    iVar21 = pnVar25->tile_held;
  } while (bVar12);
  uVar19 = 0;
  if (0 < num_proc) {
    uVar19 = (ulong)(uint)num_proc;
  }
  lVar16 = uVar19 + 1;
  pnVar15 = local_a8 + -1;
  do {
    lVar16 = lVar16 + -1;
    pnVar20 = pnVar25;
    if (lVar16 == 0) break;
    pnVar20 = pnVar15 + 1;
    pnVar1 = pnVar15 + 1;
    pnVar15 = pnVar20;
  } while (pnVar1->rank != rank);
  pnVar20->tile_sending = -1;
  pnVar20->tile_receiving = -1;
  uVar14 = pnVar20->tile_held;
  if (uVar14 != tile_displayed && -1 < (int)uVar14) {
    pnVar20->tile_sending = uVar14;
    pnVar20->send_dest = local_c0[uVar14];
    pnVar20->tile_held = -1;
    uVar14 = 0xffffffff;
  }
  if ((-1 < tile_displayed) && (uVar14 != tile_displayed)) {
    lVar16 = -0x1c;
    do {
      lVar24 = lVar16;
      if (uVar19 * 0x1c - (lVar24 + 0x1c) == 0) goto LAB_00114fad;
      lVar16 = lVar24 + 0x1c;
    } while (*(int *)((long)&local_a8[1].tile_held + lVar24) != tile_displayed);
    pnVar20->tile_receiving = tile_displayed;
    pnVar20->recv_src = *(int *)((long)&local_a8[1].rank + lVar24);
    pnVar20->tile_held = tile_displayed;
  }
LAB_00114fad:
  do_send_receive(pnVar20,iVar21,num_tiles,params,local_c8,local_90,(IceTSizeType)local_88,local_98)
  ;
  image.opaque_internals = local_c8.opaque_internals;
  if ((-1 < tile_displayed) && (tile_displayed != pnVar20->tile_held)) {
    if (params[num_tiles * rank + tile_displayed] == '\0') {
      icetImageSetDimensions
                (local_c8,local_80[(ulong)(uint)(tile_displayed << 2) + 2],
                 local_80[(ulong)(uint)(tile_displayed << 2) + 3]);
      icetClearImage(image);
    }
    else {
      icetGetTileImage(tile_displayed,local_c8);
    }
  }
  return (IceTImage)local_c8.opaque_internals;
code_r0x00114c96:
  uStack_58._0_4_ = pnVar25->rank;
  uStack_58._4_4_ = pnVar25->num_contained;
  uVar3 = pnVar25->tile_held;
  uVar4 = pnVar25->tile_sending;
  uVar5 = pnVar25->tile_receiving;
  uStack_44._0_4_ = pnVar25->send_dest;
  uStack_44._4_4_ = pnVar25->recv_src;
  iVar8 = pnVar15->rank;
  iVar9 = pnVar15->num_contained;
  iVar10 = pnVar25[1].tile_held;
  iVar11 = pnVar25[1].tile_sending;
  iVar22 = pnVar25[1].tile_receiving;
  iVar2 = pnVar25[1].send_dest;
  iVar7 = pnVar25[1].recv_src;
  pnVar25->tile_sending = pnVar25[1].tile_sending;
  pnVar25->tile_receiving = iVar22;
  pnVar25->send_dest = iVar2;
  pnVar25->recv_src = iVar7;
  pnVar25->rank = iVar8;
  pnVar25->num_contained = iVar9;
  pnVar25->tile_held = iVar10;
  pnVar25->tile_sending = iVar11;
  pnVar15->rank = (undefined4)uStack_58;
  pnVar15->num_contained = uStack_58._4_4_;
  pnVar25[1].tile_held = uVar3;
  pnVar25[1].tile_sending = uVar4;
  pnVar25[1].tile_sending = uVar4;
  pnVar25[1].tile_receiving = uVar5;
  pnVar25[1].send_dest = (undefined4)uStack_44;
  pnVar25[1].recv_src = uStack_44._4_4_;
  uStack_50 = uVar3;
  local_4c = uVar4;
  uStack_48 = uVar5;
  bVar12 = true;
  goto LAB_00114c76;
}

Assistant:

IceTImage icetVtreeCompose(void)
{
    IceTInt rank, num_proc;
    IceTInt num_tiles;
    IceTInt max_width, max_height;
    const IceTInt *display_nodes;
    IceTInt tile_displayed;
    IceTBoolean *all_contained_tmasks;
    const IceTInt *tile_viewports;
    IceTImage image;
    IceTVoid *inSparseImageBuffer;
    IceTSparseImage outSparseImage;
    IceTSizeType sparseImageSize;
    struct node_info *info;
    struct node_info *my_info;
    int tile, node;
    int tiles_transfered;
    int tile_held = -1;

    icetRaiseDebug("In vtreeCompose");

  /* Get state. */
    icetGetIntegerv(ICET_RANK, &rank);
    icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);
    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);
    icetGetIntegerv(ICET_TILE_MAX_WIDTH, &max_width);
    icetGetIntegerv(ICET_TILE_MAX_HEIGHT, &max_height);
    display_nodes = icetUnsafeStateGetInteger(ICET_DISPLAY_NODES);
    tile_viewports = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
    icetGetIntegerv(ICET_TILE_DISPLAYED, &tile_displayed);

  /* Allocate buffers. */
    sparseImageSize = icetSparseImageBufferSize(max_width, max_height);

    image                = icetGetStateBufferImage(VTREE_IMAGE_BUFFER,
                                                   max_width, max_height);
    inSparseImageBuffer  = icetGetStateBuffer(VTREE_IN_SPARSE_IMAGE_BUFFER,
                                              sparseImageSize);
    outSparseImage       = icetGetStateBufferSparseImage(
                                                  VTREE_OUT_SPARSE_IMAGE_BUFFER,
                                                  max_width, max_height);
    info                 = icetGetStateBuffer(VTREE_INFO_BUFFER,
                                             sizeof(struct node_info)*num_proc);
    all_contained_tmasks = icetGetStateBuffer(VTREE_ALL_CONTAINED_TMASKS_BUFFER,
                                        sizeof(IceTBoolean)*num_proc*num_tiles);

    icetGetBooleanv(ICET_ALL_CONTAINED_TILES_MASKS, all_contained_tmasks);
    
  /* Initialize info array. */
    for (node = 0; node < num_proc; node++) {
        info[node].rank = node;
        info[node].tile_held = -1;        /* Id of tile image held in memory. */
        info[node].num_contained = 0;        /* # of images to be rendered. */
        for (tile = 0; tile < num_tiles; tile++) {
            if (all_contained_tmasks[node*num_tiles + tile]) {
                info[node].num_contained++;
            }
        }
    }

#define CONTAINS_TILE(nodei, tile)                                \
    (all_contained_tmasks[info[nodei].rank*num_tiles+(tile)])

    tile_held = -1;
    do {
        int recv_node;

        tiles_transfered = 0;
        sort_by_contained(info, num_proc);
        for (node = 0; node < num_proc; node++) {
            info[node].tile_sending = -1;
            info[node].tile_receiving = -1;
        }

        for (recv_node = 0; recv_node < num_proc; recv_node++) {
            struct node_info *recv_info = info + recv_node;

            if (recv_info->tile_receiving >= 0) continue;

            if (recv_info->tile_held >= 0) {
              /* This node is holding a tile.  It must either send or
                 receive this tile. */
                if (find_sender(info, num_proc, recv_node, recv_info->tile_held,
                                display_nodes[recv_info->tile_held],
                                num_tiles, all_contained_tmasks)) {
                    tiles_transfered = 1;
                    continue;
                }

              /* Could not find a match for a sender, how about someone who
                 can receive it? */
                if (   (recv_info->tile_sending < 0)
                    && (recv_info->rank != display_nodes[recv_info->tile_held])
                    && find_receiver(info, num_proc, recv_node,
                                     recv_info->tile_held,
                                     display_nodes[recv_info->tile_held],
                                     num_tiles, all_contained_tmasks) ) {
                    tiles_transfered = 1;
                } else {
                  /* Could not send or receive.  Give up. */
                    continue;
                }
            }

          /* OK.  Let's try to receive any tile that we still have. */
            for (tile = 0; tile < num_tiles; tile++) {
                if (   (   !CONTAINS_TILE(recv_node, tile)
                        && (display_nodes[tile] != recv_info->rank) )
                    || (recv_info->tile_sending == tile) ) continue;
                if (find_sender(info, num_proc, recv_node, tile,
                                display_nodes[tile], num_tiles,
                                all_contained_tmasks)) {
                    tiles_transfered = 1;
                    break;
                }
            }
        }

      /* Now that we figured out who is sending to who, do the actual
         send and receive. */
        my_info = NULL;
        for (node = 0; node < num_proc; node++) {
            if (info[node].rank == rank) {
                my_info = info + node;
                break;
            }
        }

        do_send_receive(my_info, tile_held, num_tiles,
                        all_contained_tmasks,
                        image, inSparseImageBuffer, sparseImageSize,
                        outSparseImage);

        tile_held = my_info->tile_held;

    } while (tiles_transfered);

  /* It's possible that a composited image ended up on a processor that        */
  /* is not the display node for that image.  Do one last round of        */
  /* transfers to make sure all the tiles ended up in the right place.        */
    for (node = 0; node < num_proc; node++) {
        if (info[node].rank == rank) {
            my_info = info + node;
            break;
        }
    }
    my_info->tile_receiving = -1;
    my_info->tile_sending = -1;
    if ((my_info->tile_held >= 0) && (my_info->tile_held != tile_displayed)) {
      /* I'm holding an image that does not belong to me.  Ship it off. */
        my_info->tile_sending = my_info->tile_held;
        my_info->send_dest = display_nodes[my_info->tile_held];
        my_info->tile_held = -1;
    }
    if ((my_info->tile_held != tile_displayed) && (tile_displayed >= 0)) {
      /* Someone may be holding an image that belongs to me.  Check. */
        for (node = 0; node < num_proc; node++) {
            if (info[node].tile_held == tile_displayed) {
                my_info->tile_receiving = tile_displayed;
                my_info->recv_src = info[node].rank;
                my_info->tile_held = tile_displayed;
                break;
            }
        }
    }
    do_send_receive(my_info, tile_held,
                    num_tiles, all_contained_tmasks,
                    image, inSparseImageBuffer, sparseImageSize,
                    outSparseImage);
    tile_held = my_info->tile_held;

  /* Hacks for when "this" tile was not rendered. */
    if ((tile_displayed >= 0) && (tile_displayed != tile_held)) {
        if (all_contained_tmasks[rank*num_tiles + tile_displayed]) {
          /* Only "this" node draws "this" tile.  Because the image never */
          /* needed to be transferred, it was never rendered above.  Just */
          /* render it now.                                                  */
            icetRaiseDebug("Rendering tile to display.");
          /* This may uncessarily read a buffer if not outputing an input
             buffer */
            icetGetTileImage(tile_displayed, image);
        } else {
          /* "This" tile is blank. */
            const IceTInt *display_tile_viewport
                = tile_viewports + 4*tile_displayed;
            IceTInt display_tile_width = display_tile_viewport[2];
            IceTInt display_tile_height = display_tile_viewport[3];

            icetRaiseDebug("Returning blank image.");
            icetImageSetDimensions(
                                image, display_tile_width, display_tile_height);
            icetClearImage(image);
        }
    }

    return image;
}